

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
     ::
     eval_dynamic_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>,double>
               (DenseStorage<double,__1,__1,__1,_0> *dst,long *lhs,type rhs,
               assign_op<double,_double> *func)

{
  ulong rows;
  ulong cols;
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType local_88;
  DstEvaluatorType local_50;
  restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>_>
  local_40;
  
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.m_matrix = (non_const_type)*lhs;
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = ((local_88.
                  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                ).m_storage.m_rows;
  if (local_88.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_innerDim !=
      (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/Product.h"
                  ,0x62,
                  "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 1]"
                 );
  }
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d.data =
       ((local_88.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
       m_storage.m_data;
  rows = ((local_88.
           super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
         m_storage.m_cols;
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d
  .data = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data;
  cols = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = rhs;
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d.
  m_outerStride = rows;
  local_88.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>.m_d
  .m_outerStride = cols;
  if ((dst->m_rows != rows) || (uVar2 = cols, uVar4 = rows, dst->m_cols != cols)) {
    if ((long)(cols | rows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && rows != 0) &&
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar1 / SEXT816((long)cols),0) < (long)rows)) {
      puVar3 = (undefined8 *)
               __cxa_allocate_exception
                         (8,local_88.
                            super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            .m_lhsImpl.
                            super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::IndexBased,_double>
                            .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                            .m_d.data,SUB168(auVar1 % SEXT816((long)cols),0));
      *puVar3 = operator_delete;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize(dst,cols * rows,rows,cols);
    uVar4 = dst->m_rows;
    uVar2 = dst->m_cols;
  }
  if ((uVar4 == rows) && (uVar2 == cols)) {
    local_50.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d
    .data = dst->m_data;
    local_40.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_1>
    .m_dst = &local_50;
    local_50.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d
    .m_outerStride = rows;
    local_40.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_1>
    .m_src = &local_88;
    local_40.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_1>
    .m_functor = func;
    local_40.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_1>
    .m_dstExpr = (DstXprType *)dst;
    dense_assignment_loop<Eigen::internal::restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<double,_double>_>,_4,_0>
    ::run(&local_40);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2eb,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
  void eval_dynamic_impl(Dst& dst, const LhsT& lhs, const RhsT& rhs, const Func &func, const Scalar&  s /* == 1 */, false_type)
  {
    EIGEN_UNUSED_VARIABLE(s);
    eigen_internal_assert(s==Scalar(1));
    call_restricted_packet_assignment_no_alias(dst, lhs.lazyProduct(rhs), func);
  }